

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QConfFile_*>_>::erase
          (Data<QHashPrivate::Node<QString,_QConfFile_*>_> *this,Bucket bucket)

{
  size_t sVar1;
  ulong uVar2;
  size_t bucket_00;
  size_t fromIndex;
  Span<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *this_00;
  Span *fromSpan;
  long in_FS_OFFSET;
  Bucket local_58;
  Bucket local_48;
  long local_38;
  
  bucket_00 = bucket.index;
  this_00 = bucket.span;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  Span<QHashPrivate::Node<QString,_QConfFile_*>_>::erase
            ((Span<QHashPrivate::Node<QString,_QConfFile_*>_> *)this_00,bucket_00);
  *(long *)(this + 8) = *(long *)(this + 8) + -1;
  local_48.span = this_00;
  local_48.index = bucket_00;
LAB_003df0af:
  do {
    Bucket::advanceWrapped(&local_48,(Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *)this);
    fromIndex = local_48.index;
    fromSpan = local_48.span;
    if ((local_48.span)->offsets[local_48.index] == 0xff) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    sVar1 = ::qHash((QString *)
                    (((local_48.span)->entries->storage).data +
                    (ulong)(local_48.span)->offsets[local_48.index] * 0x20),*(size_t *)(this + 0x18)
                   );
    uVar2 = *(long *)(this + 0x10) - 1U & sVar1;
    local_58.span = (Span *)((uVar2 >> 7) * 0x90 + *(long *)(this + 0x20));
    local_58.index = (size_t)((uint)uVar2 & 0x7f);
    while( true ) {
      if ((local_58.span == fromSpan) && (local_58.index == fromIndex)) goto LAB_003df0af;
      if ((local_58.span == this_00) && (local_58.index == bucket_00)) break;
      Bucket::advanceWrapped(&local_58,(Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *)this);
      fromIndex = local_48.index;
      fromSpan = local_48.span;
    }
    if (fromSpan == this_00) {
      this_00->offsets[bucket_00] = this_00->offsets[fromIndex];
      this_00->offsets[fromIndex] = 0xff;
      bucket_00 = local_48.index;
      this_00 = local_48.span;
    }
    else {
      Span<QHashPrivate::Node<QString,_QConfFile_*>_>::moveFromSpan
                ((Span<QHashPrivate::Node<QString,_QConfFile_*>_> *)this_00,fromSpan,fromIndex,
                 bucket_00);
      bucket_00 = local_48.index;
      this_00 = local_48.span;
    }
  } while( true );
}

Assistant:

void erase(Bucket bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket.span->hasNode(bucket.index));
        bucket.span->erase(bucket.index);
        --size;

        // re-insert the following entries to avoid holes
        Bucket next = bucket;
        while (true) {
            next.advanceWrapped(this);
            size_t offset = next.offset();
            if (offset == SpanConstants::UnusedEntry)
                return;
            size_t hash = QHashPrivate::calculateHash(next.nodeAtOffset(offset).key, seed);
            Bucket newBucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
            while (true) {
                if (newBucket == next) {
                    // nothing to do, item is at the right plae
                    break;
                } else if (newBucket == bucket) {
                    // move into the hole we created earlier
                    if (next.span == bucket.span) {
                        bucket.span->moveLocal(next.index, bucket.index);
                    } else {
                        // move between spans, more expensive
                        bucket.span->moveFromSpan(*next.span, next.index, bucket.index);
                    }
                    bucket = next;
                    break;
                }
                newBucket.advanceWrapped(this);
            }
        }
    }